

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmltok_impl.c
# Opt level: O2

int normal_contentTok(ENCODING *enc,char *ptr,char *end,char **nextTokPtr)

{
  char **ppcVar1;
  char cVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  byte *pbVar6;
  char **ppcVar7;
  uint uVar8;
  uint *puVar9;
  long lVar10;
  uint uVar11;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  uint *extraout_RDX_05;
  uint *extraout_RDX_06;
  uint *extraout_RDX_07;
  uint *extraout_RDX_08;
  uint *extraout_RDX_09;
  uint *extraout_RDX_10;
  uint *extraout_RDX_11;
  uint *extraout_RDX_12;
  uint *extraout_RDX_13;
  uint *extraout_RDX_14;
  uint *extraout_RDX_15;
  uint *extraout_RDX_16;
  uint *extraout_RDX_17;
  uint *extraout_RDX_18;
  uint *extraout_RDX_19;
  uint *extraout_RDX_20;
  byte *pbVar12;
  unsigned_short *in_R8;
  char **ppcVar13;
  char *pcVar14;
  char *pcVar15;
  char **ppcVar16;
  bool bVar17;
  unsigned_short **ppuStack_60;
  int local_4c;
  char **local_48;
  long local_40;
  char *local_38;
  
  if (ptr == end) {
    return -4;
  }
  puVar9 = &switchD_00151abb::switchdataD_001c8590;
  pcVar14 = end;
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
  case 0:
  case 1:
  case 8:
    break;
  case 2:
    pbVar12 = (byte *)(ptr + 1);
    if (pbVar12 == (byte *)end) {
      return -1;
    }
    ppuStack_60 = (unsigned_short **)&switchD_00151c20::switchdataD_001c85bc;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar12)) {
    case 5:
      if ((long)end - (long)pbVar12 < 2) {
        return -2;
      }
      iVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,pbVar12);
      if (iVar5 != 0) {
        ptr = ptr + 3;
        goto LAB_00151c26;
      }
      break;
    case 6:
      if ((long)end - (long)pbVar12 < 3) {
        return -2;
      }
      iVar5 = (*enc[3].scanners[0])
                        (enc,(char *)pbVar12,end,(char **)&switchD_00151c20::switchdataD_001c85bc);
      if (iVar5 != 0) {
        ptr = ptr + 4;
        goto LAB_00151c26;
      }
      break;
    case 7:
      if ((long)end - (long)pbVar12 < 4) {
        return -2;
      }
      iVar5 = (*enc[3].scanners[1])
                        (enc,(char *)pbVar12,end,(char **)&switchD_00151c20::switchdataD_001c85bc);
      if (iVar5 != 0) {
        ptr = ptr + 5;
        goto LAB_00151c26;
      }
      break;
    case 0xf:
      iVar5 = normal_scanPi(enc,ptr + 2,end,nextTokPtr);
      return iVar5;
    case 0x10:
      pbVar12 = (byte *)(ptr + 2);
      if (pbVar12 == (byte *)end) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar12);
      if (cVar2 == '\x14') {
        pcVar14 = ptr + 3;
        if ((long)end - (long)pcVar14 < 6) {
          return -1;
        }
        pcVar15 = ptr + 9;
        lVar10 = 0;
        iVar5 = 8;
        do {
          if (lVar10 == 6) {
LAB_0015272d:
            *nextTokPtr = pcVar15;
            return iVar5;
          }
          if (pcVar14[lVar10] != (&big2_scanCdataSection_CDATA_LSQB)[lVar10]) {
            pcVar15 = pcVar14 + lVar10;
            iVar5 = 0;
            goto LAB_0015272d;
          }
          lVar10 = lVar10 + 1;
        } while( true );
      }
      if (cVar2 == '\x1b') {
        iVar5 = normal_scanComment(enc,ptr + 3,end,nextTokPtr);
        return iVar5;
      }
      goto LAB_001521ae;
    case 0x11:
      ppcVar13 = (char **)(ptr + 2);
      if (ppcVar13 == (char **)end) {
        return -1;
      }
      cVar2 = *(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
      iVar5 = 0;
      if (cVar2 == '\x05') {
        if ((long)end - (long)ppcVar13 < 2) {
          return -2;
        }
        iVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar13);
        if (iVar5 != 0) {
          ppcVar13 = (char **)(ptr + 4);
          goto LAB_0015200c;
        }
      }
      else {
        if (cVar2 == '\x06') {
          if ((long)end - (long)ppcVar13 < 3) {
            return -2;
          }
          iVar5 = (*enc[3].scanners[0])(enc,(char *)ppcVar13,end,(char **)0x0);
          if (iVar5 == 0) goto switchD_00152039_caseD_8;
          ppcVar13 = (char **)(ptr + 5);
        }
        else if (cVar2 == '\a') {
          if ((long)end - (long)ppcVar13 < 4) {
            return -2;
          }
          iVar5 = (*enc[3].scanners[1])(enc,(char *)ppcVar13,end,(char **)0x0);
          if (iVar5 == 0) goto switchD_00152039_caseD_8;
          ppcVar13 = (char **)(ptr + 6);
        }
        else {
          if ((cVar2 != '\x18') && (cVar2 != '\x16')) goto LAB_001527c7;
          ppcVar13 = (char **)(ptr + 3);
        }
LAB_0015200c:
        while( true ) {
          ppuStack_60 = (unsigned_short **)0x1;
          if (ppcVar13 == (char **)end) {
            return -1;
          }
          switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13)) {
          case 5:
            if ((long)end - (long)ppcVar13 < 2) {
              return -2;
            }
            iVar5 = (*enc[2].isPublicId)(enc,(char *)ppcVar13,(char *)0x1,(char **)0x1);
            ppuStack_60 = (unsigned_short **)0x2;
            break;
          case 6:
            if ((long)end - (long)ppcVar13 < 3) {
              return -2;
            }
            iVar5 = (*enc[2].utf8Convert)(enc,ppcVar13,(char *)0x1,(char **)0x1,(char *)in_R8);
            ppuStack_60 = (unsigned_short **)0x3;
            break;
          case 7:
            if ((long)end - (long)ppcVar13 < 4) {
              return -2;
            }
            iVar5 = (*enc[2].utf16Convert)(enc,ppcVar13,(char *)0x1,(unsigned_short **)0x1,in_R8);
            ppuStack_60 = (unsigned_short **)0x4;
            break;
          default:
            goto switchD_00152039_caseD_8;
          case 9:
          case 10:
          case 0x15:
            goto switchD_00152039_caseD_9;
          case 0xb:
            goto switchD_00152039_caseD_b;
          case 0x16:
          case 0x17:
          case 0x18:
          case 0x19:
          case 0x1a:
          case 0x1b:
            goto switchD_00152039_caseD_16;
          }
          if (iVar5 == 0) break;
switchD_00152039_caseD_16:
          ppcVar13 = (char **)((long)ppcVar13 + (long)ppuStack_60);
        }
      }
switchD_00152039_caseD_8:
      iVar5 = 0;
LAB_001527c7:
      *nextTokPtr = (char *)ppcVar13;
      return iVar5;
    case 0x16:
    case 0x18:
      ptr = ptr + 2;
LAB_00151c26:
      bVar17 = false;
      do {
        if (ptr == end) {
          return -1;
        }
        switch(*(undefined1 *)((long)enc[1].scanners + (ulong)(byte)*ptr)) {
        case 5:
          if ((long)end - (long)ptr < 2) {
            return -2;
          }
          iVar5 = (*enc[2].isPublicId)
                            (enc,ptr,(char *)&switchD_00151c5f::switchdataD_001c8668,
                             (char **)ppuStack_60);
          ppuStack_60 = (unsigned_short **)0x2;
          break;
        case 6:
          if ((long)end - (long)ptr < 3) {
            return -2;
          }
          iVar5 = (*enc[2].utf8Convert)
                            (enc,(char **)ptr,(char *)&switchD_00151c5f::switchdataD_001c8668,
                             (char **)ppuStack_60,(char *)in_R8);
          ppuStack_60 = (unsigned_short **)0x3;
          break;
        case 7:
          if ((long)end - (long)ptr < 4) {
            return -2;
          }
          iVar5 = (*enc[2].utf16Convert)
                            (enc,(char **)ptr,(char *)&switchD_00151c5f::switchdataD_001c8668,
                             ppuStack_60,in_R8);
          ppuStack_60 = (unsigned_short **)0x4;
          break;
        default:
          goto switchD_00151abb_caseD_0;
        case 9:
        case 10:
        case 0x15:
          pcVar14 = end + ~(ulong)ptr;
          goto LAB_0015211a;
        case 0xb:
          goto switchD_00151c5f_caseD_b;
        case 0x11:
          goto switchD_00151c5f_caseD_11;
        case 0x16:
        case 0x18:
        case 0x19:
        case 0x1a:
        case 0x1b:
          ppuStack_60 = (unsigned_short **)0x1;
          goto LAB_00151d4f;
        case 0x17:
          if (!bVar17) {
            pbVar12 = (byte *)((long)ptr + 1);
            if (pbVar12 == (byte *)end) {
              return -1;
            }
            cVar2 = *(char *)((long)enc[1].scanners + (ulong)*pbVar12);
            if (cVar2 == '\x05') {
              if ((long)end - (long)pbVar12 < 2) {
                return -2;
              }
              iVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,pbVar12);
              ppuStack_60 = (unsigned_short **)0x3;
            }
            else if (cVar2 == '\x06') {
              if ((long)end - (long)pbVar12 < 3) {
                return -2;
              }
              iVar5 = (*enc[3].scanners[0])
                                (enc,(char *)pbVar12,(char *)&switchD_00151c5f::switchdataD_001c8668
                                 ,(char **)ppuStack_60);
              ppuStack_60 = (unsigned_short **)0x4;
            }
            else {
              if (cVar2 != '\a') {
                ppuStack_60 = (unsigned_short **)0x2;
                bVar17 = true;
                if ((cVar2 == '\x16') || (bVar17 = true, cVar2 == '\x18')) goto LAB_00151d4f;
                goto switchD_00151c20_caseD_8;
              }
              if ((long)end - (long)pbVar12 < 4) {
                return -2;
              }
              iVar5 = (*enc[3].scanners[1])
                                (enc,(char *)pbVar12,(char *)&switchD_00151c5f::switchdataD_001c8668
                                 ,(char **)ppuStack_60);
              ppuStack_60 = (unsigned_short **)0x5;
            }
            bVar17 = true;
            if (iVar5 != 0) goto LAB_00151d4f;
            goto switchD_00151c20_caseD_8;
          }
          goto switchD_00151abb_caseD_0;
        }
        if (iVar5 == 0) goto switchD_00151abb_caseD_0;
LAB_00151d4f:
        ptr = (char *)((long)ptr + (long)ppuStack_60);
      } while( true );
    }
switchD_00151c20_caseD_8:
    *nextTokPtr = (char *)pbVar12;
    return 0;
  case 3:
    iVar5 = normal_scanRef(enc,ptr + 1,end,nextTokPtr);
    return iVar5;
  case 4:
    pbVar12 = (byte *)(ptr + 1);
    if (pbVar12 == (byte *)end) {
      return -5;
    }
    if (*pbVar12 == 0x5d) {
      ptr = ptr + 2;
      if (ptr == end) {
        return -5;
      }
      if (*ptr == 0x3e) break;
    }
    goto LAB_00151ddd;
  case 5:
    if ((long)end - (long)ptr < 2) {
      return -2;
    }
    iVar5 = (*enc[3].scanners[2])(enc,ptr,end,(char **)&switchD_00151abb::switchdataD_001c8590);
    if (iVar5 == 0) {
      pbVar12 = (byte *)(ptr + 2);
      pcVar14 = extraout_RDX_00;
      goto LAB_00151ddd;
    }
    break;
  case 6:
    if ((long)end - (long)ptr < 3) {
      return -2;
    }
    iVar5 = (*enc[3].scanners[3])(enc,ptr,end,(char **)&switchD_00151abb::switchdataD_001c8590);
    if (iVar5 == 0) {
      pbVar12 = (byte *)(ptr + 3);
      pcVar14 = extraout_RDX;
      goto LAB_00151ddd;
    }
    break;
  case 7:
    if ((long)end - (long)ptr < 4) {
      return -2;
    }
    iVar5 = (*enc[3].literalScanners[0])
                      (enc,ptr,end,(char **)&switchD_00151abb::switchdataD_001c8590);
    if (iVar5 == 0) {
      pbVar12 = (byte *)(ptr + 4);
      pcVar14 = extraout_RDX_01;
      goto LAB_00151ddd;
    }
    break;
  case 9:
    if (ptr + 1 != end) {
      pcVar14 = ptr + 1;
      if (*(char *)((long)enc[1].scanners + (ulong)(byte)ptr[1]) == '\n') {
        pcVar14 = ptr + 2;
      }
      *nextTokPtr = pcVar14;
      return 7;
    }
    return -3;
  case 10:
    *nextTokPtr = ptr + 1;
    return 7;
  default:
    pbVar12 = (byte *)(ptr + 1);
    puVar9 = (uint *)nextTokPtr;
LAB_00151ddd:
    pbVar6 = pbVar12;
    if (pbVar6 == (byte *)end) goto switchD_00151e09_caseD_0;
    switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*pbVar6)) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
    case 10:
      break;
    case 4:
      pbVar12 = pbVar6 + 1;
      if (pbVar12 == (byte *)end) break;
      if (*pbVar12 == 0x5d) {
        puVar9 = (uint *)(pbVar6 + 2);
        if (puVar9 == (uint *)end) break;
        if (*(byte *)puVar9 == 0x3e) {
          *nextTokPtr = (char *)puVar9;
          return 0;
        }
      }
      goto LAB_00151ddd;
    case 5:
      if ((1 < (long)end - (long)pbVar6) &&
         (iVar5 = (*enc[3].scanners[2])(enc,(char *)pbVar6,pcVar14,(char **)puVar9), iVar5 == 0)) {
        pbVar12 = pbVar6 + 2;
        pcVar14 = extraout_RDX_03;
        goto LAB_00151ddd;
      }
      break;
    case 6:
      if ((2 < (long)end - (long)pbVar6) &&
         (iVar5 = (*enc[3].scanners[3])(enc,(char *)pbVar6,pcVar14,(char **)puVar9), iVar5 == 0)) {
        pbVar12 = pbVar6 + 3;
        pcVar14 = extraout_RDX_02;
        goto LAB_00151ddd;
      }
      break;
    case 7:
      if ((3 < (long)end - (long)pbVar6) &&
         (iVar5 = (*enc[3].literalScanners[0])(enc,(char *)pbVar6,pcVar14,(char **)puVar9),
         iVar5 == 0)) {
        pbVar12 = pbVar6 + 4;
        pcVar14 = extraout_RDX_04;
        goto LAB_00151ddd;
      }
      break;
    default:
      pbVar12 = pbVar6 + 1;
      goto LAB_00151ddd;
    }
switchD_00151e09_caseD_0:
    *nextTokPtr = (char *)pbVar6;
    return 6;
  }
switchD_00151abb_caseD_0:
  *nextTokPtr = ptr;
  return 0;
switchD_00152039_caseD_9:
  do {
    ppcVar13 = (char **)((long)ppcVar13 + 1);
    if (ppcVar13 == (char **)end) {
      return -1;
    }
    bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
  } while ((bVar3 - 9 < 2) || (bVar3 == 0x15));
  if (bVar3 == 0xb) {
switchD_00152039_caseD_b:
    ppcVar13 = (char **)((long)ppcVar13 + 1);
    iVar5 = 5;
    goto LAB_001527c7;
  }
  goto switchD_00152039_caseD_8;
LAB_0015211a:
  ptr = (char *)((long)ptr + 1);
  if (ptr == end) {
    return -1;
  }
  uVar8 = (uint)*(byte *)((long)enc[1].scanners + (ulong)(byte)*ptr);
  uVar11 = uVar8 - 5;
  if (0x18 < uVar11) goto switchD_00151abb_caseD_0;
  puVar9 = (uint *)((long)&switchD_00152144::switchdataD_001c86cc +
                   (long)(int)(&switchD_00152144::switchdataD_001c86cc)[uVar11]);
  switch(uVar8) {
  case 5:
    if ((long)pcVar14 < 2) {
      return -2;
    }
    iVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,ptr);
    if (iVar5 == 0) goto switchD_00151abb_caseD_0;
    ppuStack_60 = (unsigned_short **)0x3;
    puVar9 = extraout_RDX_19;
    break;
  case 6:
    if ((long)pcVar14 < 3) {
      return -2;
    }
    iVar5 = (*enc[3].scanners[0])
                      (enc,ptr,(char *)puVar9,(char **)&switchD_00152144::switchdataD_001c86cc);
    if (iVar5 == 0) goto switchD_00151abb_caseD_0;
    ppuStack_60 = (unsigned_short **)0x4;
    puVar9 = extraout_RDX_18;
    break;
  case 7:
    if ((long)pcVar14 < 4) {
      return -2;
    }
    iVar5 = (*enc[3].scanners[1])
                      (enc,ptr,(char *)puVar9,(char **)&switchD_00152144::switchdataD_001c86cc);
    if (iVar5 == 0) goto switchD_00151abb_caseD_0;
    ppuStack_60 = (unsigned_short **)0x5;
    puVar9 = extraout_RDX_20;
    break;
  default:
    goto switchD_00151abb_caseD_0;
  case 9:
  case 10:
  case 0x15:
    goto switchD_00152144_caseD_9;
  case 0xb:
    goto switchD_00151c5f_caseD_b;
  case 0x11:
    goto switchD_00151c5f_caseD_11;
  case 0x16:
  case 0x18:
    ppuStack_60 = (unsigned_short **)0x2;
  }
  local_48 = (char **)((long)ptr + (long)ppuStack_60 + -1);
  local_38 = end + -2;
  bVar17 = false;
  goto LAB_00152274;
switchD_00152144_caseD_9:
  pcVar14 = pcVar14 + -1;
  goto LAB_0015211a;
LAB_00152274:
  ppcVar13 = local_48;
  if (local_48 == (char **)end) {
    return -1;
  }
  switch(*(undefined1 *)((long)enc[1].scanners + (ulong)*(byte *)local_48)) {
  case 5:
    local_4c = 0;
    if ((long)end - (long)local_48 < 2) {
      return -2;
    }
    iVar5 = (*enc[2].isPublicId)
                      (enc,(char *)local_48,(char *)puVar9,
                       (char **)&switchD_0015229e::switchdataD_001c8730);
    if (iVar5 != 0) {
      local_48 = (char **)((long)ppcVar13 + 2);
      puVar9 = extraout_RDX_06;
      goto LAB_00152274;
    }
    break;
  case 6:
    local_4c = 0;
    if ((long)end - (long)local_48 < 3) {
      return -2;
    }
    iVar5 = (*enc[2].utf8Convert)
                      (enc,local_48,(char *)puVar9,(char **)&switchD_0015229e::switchdataD_001c8730,
                       (char *)in_R8);
    if (iVar5 != 0) {
      local_48 = (char **)((long)ppcVar13 + 3);
      puVar9 = extraout_RDX_07;
      goto LAB_00152274;
    }
    break;
  case 7:
    local_4c = 0;
    if ((long)end - (long)local_48 < 4) {
      return -2;
    }
    iVar5 = (*enc[2].utf16Convert)
                      (enc,local_48,(char *)puVar9,
                       (unsigned_short **)&switchD_0015229e::switchdataD_001c8730,in_R8);
    if (iVar5 != 0) {
      local_48 = (char **)((long)ppcVar13 + 4);
      puVar9 = extraout_RDX_05;
      goto LAB_00152274;
    }
    break;
  default:
    local_4c = 0;
    break;
  case 9:
  case 10:
  case 0x15:
    do {
      ppcVar13 = (char **)((long)ppcVar13 + 1);
      if (ppcVar13 == (char **)end) {
        return -1;
      }
      bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
    } while ((bVar3 - 9 < 2) || (bVar3 == 0x15));
    local_4c = 0;
    if (bVar3 == 0xe) goto LAB_001523fa;
    break;
  case 0xe:
LAB_001523fa:
    local_4c = 0;
    do {
      ppcVar13 = (char **)((long)ppcVar13 + 1);
      if (ppcVar13 == (char **)end) {
        return -1;
      }
      bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar13);
      local_48 = ppcVar13;
      if ((bVar3 & 0xfe) == 0xc) {
switchD_00152478_caseD_4:
        local_48 = (char **)((long)local_48 + 1);
        do {
          ppcVar13 = local_48;
          if (local_48 == (char **)end) {
            return -1;
          }
          bVar4 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)local_48);
          if (bVar4 == bVar3) {
            ppcVar1 = (char **)((long)local_48 + 1);
            if (ppcVar1 == (char **)end) {
              return -1;
            }
            bVar3 = *(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar1);
            ppcVar16 = ppcVar1;
            if ((bVar3 - 9 < 2) || (bVar3 == 0x15)) {
              local_40 = 0;
              goto LAB_001525ed;
            }
            if (bVar3 == 0xb) goto LAB_001527f5;
            ppcVar7 = ppcVar1;
            if (bVar3 != 0x11) goto LAB_00152803;
            goto switchD_0015262b_caseD_11;
          }
          switch(bVar4) {
          case 0:
          case 1:
          case 2:
          case 8:
            goto switchD_00152478_caseD_0;
          case 3:
            iVar5 = normal_scanRef(enc,(char *)((long)local_48 + 1),end,(char **)&local_48);
            puVar9 = extraout_RDX_08;
            if (iVar5 < 1) {
              ppcVar16 = local_48;
              if (iVar5 != 0) {
                return iVar5;
              }
              goto LAB_00152803;
            }
            break;
          default:
            goto switchD_00152478_caseD_4;
          case 5:
            if ((long)end - (long)local_48 < 2) {
              return -2;
            }
            iVar5 = (*enc[3].scanners[2])
                              (enc,(char *)local_48,(char *)puVar9,
                               (char **)&switchD_00152478::switchdataD_001c878c);
            if (iVar5 != 0) goto switchD_00152478_caseD_0;
            local_48 = (char **)((long)ppcVar13 + 2);
            puVar9 = extraout_RDX_11;
            break;
          case 6:
            if ((long)end - (long)local_48 < 3) {
              return -2;
            }
            iVar5 = (*enc[3].scanners[3])
                              (enc,(char *)local_48,(char *)puVar9,
                               (char **)&switchD_00152478::switchdataD_001c878c);
            if (iVar5 != 0) goto switchD_00152478_caseD_0;
            local_48 = (char **)((long)ppcVar13 + 3);
            puVar9 = extraout_RDX_10;
            break;
          case 7:
            if ((long)end - (long)local_48 < 4) {
              return -2;
            }
            iVar5 = (*enc[3].literalScanners[0])
                              (enc,(char *)local_48,(char *)puVar9,
                               (char **)&switchD_00152478::switchdataD_001c878c);
            if (iVar5 != 0) goto switchD_00152478_caseD_0;
            local_48 = (char **)((long)ppcVar13 + 4);
            puVar9 = extraout_RDX_09;
          }
        } while( true );
      }
    } while ((bVar3 < 0x16) && ((0x200600U >> (bVar3 & 0x1f) & 1) != 0));
    break;
  case 0x16:
  case 0x18:
  case 0x19:
  case 0x1a:
  case 0x1b:
    local_48 = (char **)((long)local_48 + 1);
    goto LAB_00152274;
  case 0x17:
    local_4c = 0;
    if (bVar17) break;
    ppcVar16 = (char **)((long)local_48 + 1);
    if (ppcVar16 == (char **)end) {
      return -1;
    }
    cVar2 = *(char *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar16);
    if (cVar2 == '\x05') {
      if ((long)end - (long)ppcVar16 < 2) {
        return -2;
      }
      local_48 = ppcVar16;
      iVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,ppcVar16);
      if (iVar5 == 0) goto LAB_00152803;
      local_48 = (char **)((long)ppcVar13 + 3);
      puVar9 = extraout_RDX_14;
    }
    else if (cVar2 == '\x06') {
      if ((long)end - (long)ppcVar16 < 3) {
        return -2;
      }
      local_48 = ppcVar16;
      iVar5 = (*enc[3].scanners[0])
                        (enc,(char *)ppcVar16,(char *)puVar9,
                         (char **)&switchD_0015229e::switchdataD_001c8730);
      if (iVar5 == 0) goto LAB_00152803;
      local_48 = (char **)((long)ppcVar13 + 4);
      puVar9 = extraout_RDX_12;
    }
    else if (cVar2 == '\a') {
      if ((long)end - (long)ppcVar16 < 4) {
        return -2;
      }
      local_48 = ppcVar16;
      iVar5 = (*enc[3].scanners[1])
                        (enc,(char *)ppcVar16,(char *)puVar9,
                         (char **)&switchD_0015229e::switchdataD_001c8730);
      if (iVar5 == 0) goto LAB_00152803;
      local_48 = (char **)((long)ppcVar13 + 5);
      puVar9 = extraout_RDX_13;
    }
    else {
      if ((cVar2 != '\x18') && (cVar2 != '\x16')) goto LAB_00152803;
      local_48 = (char **)((long)local_48 + 2);
    }
    bVar17 = true;
    goto LAB_00152274;
  }
switchD_00152478_caseD_0:
  ppcVar16 = ppcVar13;
  goto LAB_00152803;
LAB_001525ed:
  ppcVar7 = (char **)((long)local_48 + local_40 + 2);
  if (ppcVar7 == (char **)end) {
    return -1;
  }
  uVar8 = (uint)*(byte *)((long)enc[1].scanners + (ulong)*(byte *)ppcVar7);
  uVar11 = uVar8 - 5;
  if (0x13 < uVar11) {
switchD_0015262b_caseD_8:
    ppcVar16 = (char **)((long)local_48 + local_40 + 2);
    goto LAB_00152803;
  }
  ppcVar16 = (char **)((long)ppcVar16 + 1);
  puVar9 = &switchD_0015262b::switchdataD_001c87b0;
  switch(uVar8) {
  case 5:
    goto switchD_0015262b_caseD_5;
  case 6:
    if ((long)(local_38 + (-local_40 - (long)local_48)) < 3) {
      return -2;
    }
    pbVar12 = (byte *)((long)local_48 + local_40 + 2);
    local_48 = ppcVar1;
    iVar5 = (*enc[3].scanners[0])
                      (enc,(char *)pbVar12,(char *)&switchD_0015262b::switchdataD_001c87b0,
                       (char **)((long)&switchD_0015262b::switchdataD_001c87b0 +
                                (long)(int)(&switchD_0015262b::switchdataD_001c87b0)[uVar11]));
    if (iVar5 == 0) goto LAB_00152803;
    local_48 = (char **)((long)ppcVar13 + local_40 + 5);
    puVar9 = extraout_RDX_15;
    goto LAB_00152718;
  case 7:
    if ((long)(local_38 + (-local_40 - (long)local_48)) < 4) {
      return -2;
    }
    ppcVar16 = (char **)((long)local_48 + local_40 + 2);
    local_48 = ppcVar1;
    iVar5 = (*enc[3].scanners[1])
                      (enc,(char *)ppcVar16,(char *)&switchD_0015262b::switchdataD_001c87b0,
                       (char **)((long)&switchD_0015262b::switchdataD_001c87b0 +
                                (long)(int)(&switchD_0015262b::switchdataD_001c87b0)[uVar11]));
    if (iVar5 == 0) goto LAB_00152803;
    local_48 = (char **)((long)ppcVar13 + local_40 + 6);
    puVar9 = extraout_RDX_17;
    goto LAB_00152718;
  default:
    goto switchD_0015262b_caseD_8;
  case 9:
  case 10:
  case 0x15:
    break;
  case 0xb:
    local_48 = (char **)((long)local_48 + local_40 + 1);
LAB_001527f5:
    ppcVar13 = (char **)((long)local_48 + 2);
    local_4c = 1;
    goto switchD_00152478_caseD_0;
  case 0x11:
    goto switchD_0015262b_caseD_11;
  case 0x16:
  case 0x18:
    local_48 = (char **)((long)local_48 + local_40 + 3);
    goto LAB_00152718;
  }
  local_40 = local_40 + 1;
  goto LAB_001525ed;
switchD_0015262b_caseD_11:
  if ((char **)((long)ppcVar7 + 1) == (char **)end) {
    return -1;
  }
  bVar17 = *(byte *)((long)ppcVar7 + 1) == 0x3e;
  ppcVar16 = (char **)((long)ppcVar7 + 1);
  if (bVar17) {
    ppcVar16 = (char **)((long)ppcVar7 + 2);
  }
  local_4c = (uint)bVar17 * 3;
  goto LAB_00152803;
switchD_00151c5f_caseD_b:
  *nextTokPtr = (char *)((long)ptr + 1);
  return 2;
switchD_00151c5f_caseD_11:
  pbVar12 = (byte *)((long)ptr + 1);
  if (pbVar12 == (byte *)end) {
    return -1;
  }
  if (*pbVar12 == 0x3e) {
    *nextTokPtr = (char *)((long)ptr + 2);
    return 4;
  }
LAB_001521ae:
  *nextTokPtr = (char *)pbVar12;
  return 0;
switchD_0015262b_caseD_5:
  if ((long)(local_38 + (-local_40 - (long)local_48)) < 2) {
    return -2;
  }
  pbVar12 = (byte *)((long)local_48 + local_40 + 2);
  local_48 = ppcVar1;
  iVar5 = (**(code **)&enc[2].minBytesPerChar)(enc,pbVar12);
  if (iVar5 != 0) {
    local_48 = (char **)((long)ppcVar13 + local_40 + 4);
    puVar9 = extraout_RDX_16;
LAB_00152718:
    bVar17 = false;
    goto LAB_00152274;
  }
LAB_00152803:
  *nextTokPtr = (char *)ppcVar16;
  return local_4c;
}

Assistant:

static
int PREFIX(contentTok)(const ENCODING *enc, const char *ptr, const char *end,
                       const char **nextTokPtr)
{
  if (ptr == end)
    return XML_TOK_NONE;
  if (MINBPC(enc) > 1) {
    size_t n = end - ptr;
    if (n & (MINBPC(enc) - 1)) {
      n &= ~(MINBPC(enc) - 1);
      if (n == 0)
        return XML_TOK_PARTIAL;
      end = ptr + n;
    }
  }
  switch (BYTE_TYPE(enc, ptr)) {
  case BT_LT:
    return PREFIX(scanLt)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_AMP:
    return PREFIX(scanRef)(enc, ptr + MINBPC(enc), end, nextTokPtr);
  case BT_CR:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_CR;
    if (BYTE_TYPE(enc, ptr) == BT_LF)
      ptr += MINBPC(enc);
    *nextTokPtr = ptr;
    return XML_TOK_DATA_NEWLINE;
  case BT_LF:
    *nextTokPtr = ptr + MINBPC(enc);
    return XML_TOK_DATA_NEWLINE;
  case BT_RSQB:
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_RSQB))
      break;
    ptr += MINBPC(enc);
    if (ptr == end)
      return XML_TOK_TRAILING_RSQB;
    if (!CHAR_MATCHES(enc, ptr, ASCII_GT)) {
      ptr -= MINBPC(enc);
      break;
    }
    *nextTokPtr = ptr;
    return XML_TOK_INVALID;
  INVALID_CASES(ptr, nextTokPtr)
  default:
    ptr += MINBPC(enc);
    break;
  }
  while (ptr != end) {
    switch (BYTE_TYPE(enc, ptr)) {
#define LEAD_CASE(n) \
    case BT_LEAD ## n: \
      if (end - ptr < n || IS_INVALID_CHAR(enc, ptr, n)) { \
        *nextTokPtr = ptr; \
        return XML_TOK_DATA_CHARS; \
      } \
      ptr += n; \
      break;
    LEAD_CASE(2) LEAD_CASE(3) LEAD_CASE(4)
#undef LEAD_CASE
    case BT_RSQB:
      if (ptr + MINBPC(enc) != end) {
         if (!CHAR_MATCHES(enc, ptr + MINBPC(enc), ASCII_RSQB)) {
           ptr += MINBPC(enc);
           break;
         }
         if (ptr + 2*MINBPC(enc) != end) {
           if (!CHAR_MATCHES(enc, ptr + 2*MINBPC(enc), ASCII_GT)) {
             ptr += MINBPC(enc);
             break;
           }
           *nextTokPtr = ptr + 2*MINBPC(enc);
           return XML_TOK_INVALID;
         }
      }
      /* fall through */
    case BT_AMP:
    case BT_LT:
    case BT_NONXML:
    case BT_MALFORM:
    case BT_TRAIL:
    case BT_CR:
    case BT_LF:
      *nextTokPtr = ptr;
      return XML_TOK_DATA_CHARS;
    default:
      ptr += MINBPC(enc);
      break;
    }
  }
  *nextTokPtr = ptr;
  return XML_TOK_DATA_CHARS;
}